

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[37],char_const*,char[38],unsigned_int,char[5],unsigned_int,char[31],unsigned_int>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [37],char **Args_1,
          char (*Args_2) [38],uint *Args_3,char (*Args_4) [5],uint *Args_5,char (*Args_6) [31],
          uint *Args_7)

{
  stringstream local_1c8 [8];
  stringstream ss;
  char (*Args_local_4) [5];
  uint *Args_local_3;
  char (*Args_local_2) [38];
  char **Args_local_1;
  char (*Args_local) [37];
  
  std::__cxx11::stringstream::stringstream(local_1c8);
  FormatStrSS<std::__cxx11::stringstream,char[37],char_const*,char[38],unsigned_int,char[5],unsigned_int,char[31],unsigned_int>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
             (char (*) [37])this,(char **)Args,(char (*) [38])Args_1,(uint *)Args_2,
             (char (*) [5])Args_3,(uint *)Args_4,(char (*) [31])Args_5,(uint *)Args_6);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}